

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::LogParser::StartElement(LogParser *this,string *name,char **atts)

{
  bool bVar1;
  char *pcVar2;
  char *action;
  char *local_130;
  char *rev;
  char **local_20;
  char **atts_local;
  string *name_local;
  LogParser *this_local;
  
  local_20 = atts;
  atts_local = (char **)name;
  name_local = (string *)this;
  std::vector<char,_std::allocator<char>_>::clear(&this->CData);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          atts_local,"logentry");
  if (bVar1) {
    memset(&rev,0,0x108);
    Revision::Revision((Revision *)&rev);
    Revision::operator=(&this->Rev,(Revision *)&rev);
    Revision::~Revision((Revision *)&rev);
    (this->Rev).SVNInfo = this->SVNRepo;
    local_130 = cmXMLParser::FindAttribute(local_20,"revision");
    if (local_130 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Rev,local_130);
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::clear
              (&this->Changes);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            atts_local,"path");
    if (bVar1) {
      cmCTestGlobalVC::Change::Change((Change *)&action,'?');
      cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)&action);
      cmCTestGlobalVC::Change::~Change((Change *)&action);
      pcVar2 = cmXMLParser::FindAttribute(local_20,"action");
      if (pcVar2 != (char *)0x0) {
        (this->CurChange).Action = *pcVar2;
      }
    }
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name, const char** atts)
    {
    this->CData.clear();
    if(name == "logentry")
      {
      this->Rev = Revision();
      this->Rev.SVNInfo = &SVNRepo;
      if(const char* rev = this->FindAttribute(atts, "revision"))
        {
        this->Rev.Rev = rev;
        }
      this->Changes.clear();
      }
    else if(name == "path")
      {
      this->CurChange = Change();
      if(const char* action = this->FindAttribute(atts, "action"))
        {
        this->CurChange.Action = action[0];
        }
      }
    }